

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O0

bool __thiscall
dg::ADT::
SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
::get(SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      *this,unsigned_long i)

{
  bool bVar1;
  pointer pvVar2;
  unsigned_long in_RSI;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_RDI;
  const_iterator it;
  unsigned_long sft;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_28;
  unsigned_long local_20;
  unsigned_long local_18;
  bool local_1;
  
  local_18 = in_RSI;
  local_20 = _shift(in_RSI);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::find(in_RDI,(key_type *)0x1928e4);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::end(in_RDI);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    local_1 = false;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>
                         *)0x19291d);
    local_1 = (pvVar2->second & 1L << ((char)local_18 - (char)local_20 & 0x3fU)) != 0;
  }
  return local_1;
}

Assistant:

bool get(IndexT i) const {
        auto sft = _shift(i);
        assert(sft % BITS_IN_BUCKET == 0);

        auto it = _bits.find(sft);
        if (it == _bits.end()) {
            return false;
        }

        return (it->second & (BitsT{1} << (i - sft)));
    }